

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  byte *pbVar1;
  char cVar2;
  bool bVar3;
  pid_t pVar4;
  undefined8 uVar5;
  _func_int_sqlite3_file_ptr *p_Var6;
  __pid_t _Var7;
  int iVar8;
  int iVar9;
  int iVar10;
  sqlite3_io_methods *psVar11;
  size_t sVar12;
  int *piVar13;
  char *pcVar14;
  sqlite3_io_methods *psVar15;
  UnixUnusedFd **ppUVar16;
  uint *puVar17;
  sqlite3_mutex *psVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  dev_t *pdVar22;
  uint uVar23;
  mode_t m;
  sqlite3_io_methods *psVar24;
  uint uVar25;
  uint uVar26;
  uint f;
  unixInodeInfo *puVar27;
  long in_FS_OFFSET;
  undefined1 auVar28 [16];
  char zTmpname [514];
  uint local_534;
  uint local_520;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  uint local_4d0;
  uint local_4cc;
  uint local_4c8;
  dev_t local_458;
  u64 local_450;
  undefined1 uStack_249;
  undefined8 local_248;
  _func_int_sqlite3_file_ptr *p_Stack_240;
  uint local_230;
  uint local_22c;
  uint local_228;
  long local_38;
  
  pVar4 = randomnessPid;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar26 = flags & 0xfff00;
  if (((flags & 4U) == 0) ||
     (((bVar3 = true, uVar26 != 0x800 && (uVar26 != 0x4000)) && (uVar26 != 0x80000)))) {
    bVar3 = false;
  }
  _Var7 = getpid();
  if (pVar4 != _Var7) {
    randomnessPid = getpid();
    sqlite3_randomness(0,(void *)0x0);
  }
  *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
  pFile[0xe].pMethods = (sqlite3_io_methods *)0x0;
  pdVar22 = (dev_t *)zPath;
  if (uVar26 == 0x100) {
    if (unixBigLock != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
    }
    if (((inodeList == (unixInodeInfo *)0x0) ||
        (iVar8 = (*aSyscall[4].pCurrent)(zPath,&local_458), iVar8 != 0)) ||
       (inodeList == (unixInodeInfo *)0x0)) {
      psVar11 = (sqlite3_io_methods *)0x0;
    }
    else {
      psVar11 = (sqlite3_io_methods *)0x0;
      puVar27 = inodeList;
      do {
        if (((puVar27->fileId).dev == local_458) && ((puVar27->fileId).ino == local_450)) {
          if (puVar27->pLockMutex != (sqlite3_mutex *)0x0) {
            (*sqlite3Config.mutex.xMutexEnter)(puVar27->pLockMutex);
          }
          psVar11 = (sqlite3_io_methods *)puVar27->pUnused;
          if (psVar11 == (sqlite3_io_methods *)0x0) goto LAB_00117143;
          if (*(uint *)&psVar11->field_0x4 != (flags & 3U)) goto LAB_001170ff;
          ppUVar16 = &puVar27->pUnused;
          goto LAB_00117115;
        }
        puVar27 = puVar27->pNext;
      } while (puVar27 != (unixInodeInfo *)0x0);
    }
    goto LAB_00116bdb;
  }
  iVar8 = -1;
  if (zPath == (char *)0x0) {
    pdVar22 = &local_458;
    iVar9 = unixGetTempname(pVfs->mxPathname,(char *)pdVar22);
    if (iVar9 != 0) goto LAB_001173a2;
  }
  goto LAB_00116c49;
LAB_00117143:
  psVar11 = (sqlite3_io_methods *)0x0;
  goto LAB_00117146;
  while (*(uint *)&psVar11->field_0x4 != (flags & 3U)) {
LAB_001170ff:
    psVar24 = psVar11;
    psVar11 = (sqlite3_io_methods *)psVar24->xClose;
    if (psVar11 == (sqlite3_io_methods *)0x0) goto LAB_00117143;
  }
  ppUVar16 = (UnixUnusedFd **)&psVar24->xClose;
LAB_00117115:
  *ppUVar16 = (UnixUnusedFd *)psVar11->xClose;
LAB_00117146:
  if (puVar27->pLockMutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(puVar27->pLockMutex);
  }
LAB_00116bdb:
  if (unixBigLock != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
  }
  if (psVar11 == (sqlite3_io_methods *)0x0) {
    iVar8 = sqlite3_initialize();
    iVar9 = 7;
    if ((iVar8 != 0) ||
       (psVar11 = (sqlite3_io_methods *)sqlite3Malloc(0x10), psVar11 == (sqlite3_io_methods *)0x0))
    goto LAB_001173a2;
    iVar8 = -1;
  }
  else {
    iVar8 = psVar11->iVersion;
  }
  pFile[6].pMethods = psVar11;
LAB_00116c49:
  uVar19 = flags & 8;
  local_520 = flags & 1;
  local_534 = flags;
  if (iVar8 < 0) {
    local_520 = flags & 1;
    if ((flags & 0x80800U) == 0) {
      if (uVar19 == 0) {
        uVar23 = 0;
        if ((flags & 0x40U) == 0) {
          uVar25 = 0;
          m = 0;
          uVar23 = 0;
        }
        else {
          pcVar14 = sqlite3_uri_parameter((char *)pdVar22,"modeof");
          uVar25 = 0;
          m = 0;
          if (pcVar14 != (char *)0x0) {
            iVar8 = (*aSyscall[4].pCurrent)(pcVar14,&local_248);
            if (iVar8 == 0) {
              m = local_230 & 0x1ff;
              iVar9 = 0;
            }
            else {
              iVar9 = 0x70a;
              local_22c = 0;
              local_228 = 0;
            }
            goto LAB_001171f9;
          }
        }
      }
      else {
        m = 0x180;
        uVar23 = 0;
        uVar25 = 0;
      }
    }
    else {
      if (pdVar22 == (dev_t *)0x0) {
        uVar20 = 0;
      }
      else {
        sVar12 = strlen((char *)pdVar22);
        uVar20 = (ulong)((uint)sVar12 & 0x3fffffff);
      }
      m = 0;
      local_22c = 0;
      local_228 = 0;
      iVar9 = 0;
      do {
        uVar21 = uVar20;
        if ((long)uVar21 < 2) {
          local_22c = 0;
          local_228 = 0;
          goto LAB_001171f9;
        }
        cVar2 = *(char *)((long)pdVar22 + (uVar21 - 1));
        if (cVar2 == '.') goto LAB_001171f9;
        uVar20 = uVar21 - 1;
      } while (cVar2 != '-');
      memcpy(&local_248,pdVar22,uVar21 - 1);
      (&uStack_249)[uVar21] = 0;
      iVar8 = (*aSyscall[4].pCurrent)(&local_248,&local_4e8);
      if (iVar8 == 0) {
        m = local_4d0 & 0x1ff;
        local_22c = local_4cc;
        local_228 = local_4c8;
      }
      else {
        iVar9 = 0x70a;
        m = 0;
        local_22c = 0;
        local_228 = 0;
      }
LAB_001171f9:
      uVar25 = local_22c;
      uVar23 = local_228;
      if (iVar9 != 0) goto LAB_001173a2;
    }
    f = (flags & 4U) * 0x10 + (flags & 0x10U) * 8 + (flags & 2U) + 0x20000;
    iVar8 = robust_open((char *)pdVar22,f,m);
    if (-1 < iVar8) {
LAB_00117243:
      if (((flags & 0x80800U) != 0 && m != 0) && (iVar9 = (*aSyscall[0x15].pCurrent)(), iVar9 == 0))
      {
        (*aSyscall[0x14].pCurrent)(iVar8,(ulong)uVar25,(ulong)uVar23);
      }
      goto LAB_00116c68;
    }
    puVar17 = (uint *)__errno_location();
    if ((bVar3) && (*puVar17 == 0xd)) {
      iVar8 = (*aSyscall[2].pCurrent)(pdVar22,0);
      iVar9 = 0x608;
      if (iVar8 == 0) goto LAB_001172b2;
    }
    else {
LAB_001172b2:
      iVar9 = 0xe;
      if ((((flags & 2U) != 0) && (*puVar17 != 0x15)) &&
         (iVar8 = robust_open((char *)pdVar22,f & 0x20080,m), -1 < iVar8)) {
        local_534 = (flags & 0xfffffff8U) + 1;
        local_520 = 1;
        goto LAB_00117243;
      }
    }
    sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xa2f2,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    if (pdVar22 == (dev_t *)0x0) {
      pdVar22 = (dev_t *)0x1a4219;
    }
    sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0xa2f2,(ulong)*puVar17,"open",pdVar22,"");
LAB_00117399:
    sqlite3_free(pFile[6].pMethods);
  }
  else {
LAB_00116c68:
    if (pOutFlags != (int *)0x0) {
      *pOutFlags = local_534;
    }
    psVar11 = pFile[6].pMethods;
    if (psVar11 != (sqlite3_io_methods *)0x0) {
      psVar11->iVersion = iVar8;
      *(uint *)&psVar11->field_0x4 = local_534 & 3;
    }
    if (uVar19 != 0) {
      (*aSyscall[0x10].pCurrent)();
    }
    uVar25 = uVar19 * 4 + 2;
    if (local_520 == 0) {
      uVar25 = uVar19 * 4;
    }
    uVar19 = uVar25 + 0x80;
    if (uVar26 == 0x100) {
      uVar19 = uVar25;
    }
    uVar26 = uVar19 | 8;
    if (!bVar3) {
      uVar26 = uVar19;
    }
    *(int *)&pFile[3].pMethods = iVar8;
    pFile[1].pMethods = (sqlite3_io_methods *)pVfs;
    pFile[7].pMethods = (sqlite3_io_methods *)zPath;
    *(ushort *)((long)&pFile[3].pMethods + 6) = (ushort)(local_534 & 0x40) | (ushort)uVar26;
    pFile[0xc].pMethods = (sqlite3_io_methods *)sqlite3Config.szMmap;
    pcVar14 = (char *)0x0;
    if ((local_534 & 0x40) != 0 || (uVar26 & 0x40) != 0) {
      pcVar14 = zPath;
    }
    iVar9 = sqlite3_uri_boolean(pcVar14,"psow",1);
    if (iVar9 != 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 0x10;
    }
    iVar9 = strcmp(pVfs->zName,"unix-excl");
    if (iVar9 == 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 1;
    }
    if ((char)uVar26 < '\0') {
      psVar11 = &nolockIoMethods;
LAB_00116da2:
      *(undefined4 *)&pFile[4].pMethods = 0;
    }
    else {
      psVar11 = (sqlite3_io_methods *)(**pVfs->pAppData)(zPath,pFile);
      psVar24 = &posixIoMethods;
      if (psVar11 == &posixIoMethods) {
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
        }
        iVar9 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&pFile[3].pMethods,&local_248);
        if (iVar9 == 0) {
          local_4e8 = local_248;
          uVar5 = local_4e8;
          uStack_4e0 = p_Stack_240;
          p_Var6 = uStack_4e0;
          for (psVar11 = (sqlite3_io_methods *)inodeList; local_4e8 = uVar5, uStack_4e0 = p_Var6,
              psVar11 != (sqlite3_io_methods *)0x0; psVar11 = (sqlite3_io_methods *)psVar11->xUnlock
              ) {
            local_4e8._0_1_ = (char)local_248;
            local_4e8._1_1_ = (char)((ulong)local_248 >> 8);
            local_4e8._2_1_ = (char)((ulong)local_248 >> 0x10);
            local_4e8._3_1_ = (char)((ulong)local_248 >> 0x18);
            local_4e8._4_1_ = (char)((ulong)local_248 >> 0x20);
            local_4e8._5_1_ = (char)((ulong)local_248 >> 0x28);
            local_4e8._6_1_ = (char)((ulong)local_248 >> 0x30);
            local_4e8._7_1_ = (char)((ulong)local_248 >> 0x38);
            uStack_4e0._0_1_ = (char)p_Stack_240;
            uStack_4e0._1_1_ = (char)((ulong)p_Stack_240 >> 8);
            uStack_4e0._2_1_ = (char)((ulong)p_Stack_240 >> 0x10);
            uStack_4e0._3_1_ = (char)((ulong)p_Stack_240 >> 0x18);
            uStack_4e0._4_1_ = (char)((ulong)p_Stack_240 >> 0x20);
            uStack_4e0._5_1_ = (char)((ulong)p_Stack_240 >> 0x28);
            uStack_4e0._6_1_ = (char)((ulong)p_Stack_240 >> 0x30);
            uStack_4e0._7_1_ = (char)((ulong)p_Stack_240 >> 0x38);
            auVar28[0] = -((char)((unixFileId *)&psVar11->iVersion)->dev == (char)local_4e8);
            auVar28[1] = -(*(char *)((long)&((unixFileId *)&psVar11->iVersion)->dev + 1) ==
                          local_4e8._1_1_);
            auVar28[2] = -(*(char *)((long)&((unixFileId *)&psVar11->iVersion)->dev + 2) ==
                          local_4e8._2_1_);
            auVar28[3] = -(*(char *)((long)&((unixFileId *)&psVar11->iVersion)->dev + 3) ==
                          local_4e8._3_1_);
            auVar28[4] = -(psVar11->field_0x4 == local_4e8._4_1_);
            auVar28[5] = -(psVar11->field_0x5 == local_4e8._5_1_);
            auVar28[6] = -(psVar11->field_0x6 == local_4e8._6_1_);
            auVar28[7] = -(psVar11->field_0x7 == local_4e8._7_1_);
            auVar28[8] = -(*(char *)&psVar11->xClose == (char)uStack_4e0);
            auVar28[9] = -(*(char *)((long)&psVar11->xClose + 1) == uStack_4e0._1_1_);
            auVar28[10] = -(*(char *)((long)&psVar11->xClose + 2) == uStack_4e0._2_1_);
            auVar28[0xb] = -(*(char *)((long)&psVar11->xClose + 3) == uStack_4e0._3_1_);
            auVar28[0xc] = -(*(char *)((long)&psVar11->xClose + 4) == uStack_4e0._4_1_);
            auVar28[0xd] = -(*(char *)((long)&psVar11->xClose + 5) == uStack_4e0._5_1_);
            auVar28[0xe] = -(*(char *)((long)&psVar11->xClose + 6) == uStack_4e0._6_1_);
            auVar28[0xf] = -(*(char *)((long)&psVar11->xClose + 7) == uStack_4e0._7_1_);
            if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar28[0xf] >> 7) << 0xf) == 0xffff) {
              *(int *)&psVar11->xFileSize = *(int *)&psVar11->xFileSize + 1;
              psVar15 = (sqlite3_io_methods *)inodeList;
              goto LAB_0011740a;
            }
          }
          iVar10 = sqlite3_initialize();
          iVar9 = 7;
          if ((iVar10 != 0) ||
             (psVar11 = (sqlite3_io_methods *)sqlite3Malloc(0x50),
             psVar11 == (sqlite3_io_methods *)0x0)) goto LAB_00116fe7;
          *(undefined1 (*) [16])&psVar11->xUnlock = (undefined1  [16])0x0;
          psVar11->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)0x0;
          psVar11->xLock = (_func_int_sqlite3_file_ptr_int *)0x0;
          psVar11->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
          psVar11->xSync = (_func_int_sqlite3_file_ptr_int *)0x0;
          *(undefined1 (*) [16])&psVar11->xRead = (undefined1  [16])0x0;
          *(undefined8 *)psVar11 = local_4e8;
          psVar11->xClose = uStack_4e0;
          if (sqlite3Config.bCoreMutex != '\0') {
            iVar10 = sqlite3_initialize();
            if (iVar10 == 0) {
              psVar18 = (*sqlite3Config.mutex.xMutexAlloc)(0);
              psVar11->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)psVar18;
              if (psVar18 != (sqlite3_mutex *)0x0) goto LAB_001173df;
            }
            else {
              psVar11->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
            }
            sqlite3_free(psVar11);
            goto LAB_00116fe7;
          }
LAB_001173df:
          *(int *)&psVar11->xFileSize = 1;
          psVar11->xUnlock = (_func_int_sqlite3_file_ptr_int *)inodeList;
          psVar11->xCheckReservedLock = (_func_int_sqlite3_file_ptr_int_ptr *)0x0;
          psVar15 = psVar11;
          if (inodeList != (unixInodeInfo *)0x0) {
            inodeList->pPrev = (unixInodeInfo *)psVar11;
          }
LAB_0011740a:
          inodeList = (unixInodeInfo *)psVar15;
          pFile[2].pMethods = psVar11;
          iVar9 = 0;
        }
        else {
          piVar13 = __errno_location();
          *(int *)&pFile[4].pMethods = *piVar13;
          iVar9 = 10;
LAB_00116fe7:
          robust_close((unixFile *)pFile,iVar8,0xa0e4);
          iVar8 = -1;
        }
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
        }
      }
      else {
        psVar24 = &dotlockIoMethods;
        if (psVar11 != &dotlockIoMethods) goto LAB_00116da2;
        sVar12 = strlen(zPath);
        iVar10 = sqlite3_initialize();
        iVar9 = 7;
        if (iVar10 == 0) {
          iVar10 = (int)sVar12 + 6;
          psVar15 = (sqlite3_io_methods *)sqlite3Malloc((long)iVar10);
          psVar11 = (sqlite3_io_methods *)0x0;
          if (psVar15 != (sqlite3_io_methods *)0x0) {
            sqlite3_snprintf(iVar10,(char *)psVar15,"%s.lock",zPath);
            iVar9 = 0;
            psVar11 = psVar15;
          }
        }
        else {
          psVar11 = (sqlite3_io_methods *)0x0;
        }
        pFile[5].pMethods = psVar11;
      }
      *(undefined4 *)&pFile[4].pMethods = 0;
      psVar11 = psVar24;
      if (iVar9 != 0) {
        if (-1 < iVar8) {
          robust_close((unixFile *)pFile,iVar8,0xa139);
        }
        goto LAB_00117399;
      }
    }
    pFile->pMethods = psVar11;
    verifyDbFile((unixFile *)pFile);
    iVar9 = 0;
  }
LAB_001173a2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar9;
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0x0FFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a super- or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int isNewJrnl = (isCreate && (
        eType==SQLITE_OPEN_SUPER_JOURNAL
     || eType==SQLITE_OPEN_MAIN_JOURNAL
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true:
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and super-journal are never
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_SUPER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_SUPER_JOURNAL
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  /* Detect a pid change and reset the PRNG.  There is a race condition
  ** here such that two or more threads all trying to open databases at
  ** the same instant might all reset the PRNG.  But multiple resets
  ** are harmless.
  */
  if( randomnessPid!=osGetpid(0) ){
    randomnessPid = osGetpid(0);
    sqlite3_randomness(0,0);
  }
  memset(p, 0, sizeof(unixFile));

#ifdef SQLITE_ASSERT_NO_FILES
  /* Applications that never read or write a persistent disk files */
  assert( zName==0 );
#endif

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc64(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM_BKPT;
      }
    }
    p->pPreallocatedUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !isNewJrnl);
    rc = unixGetTempname(pVfs->mxPathname, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY|O_NOFOLLOW);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pPreallocatedUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    assert( !isExclusive || (openFlags & O_CREAT)!=0 );
    if( fd<0 ){
      if( isNewJrnl && errno==EACCES && osAccess(zName, F_OK) ){
        /* If unable to create a journal because the directory is not
        ** writable, change the error code to indicate that. */
        rc = SQLITE_READONLY_DIRECTORY;
      }else if( errno!=EISDIR && isReadWrite ){
        /* Failed to open the file for read/write access. Try read-only. */
        flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
        openFlags &= ~(O_RDWR|O_CREAT);
        flags |= SQLITE_OPEN_READONLY;
        openFlags |= O_RDONLY;
        isReadonly = 1;
        fd = robust_open(zName, openFlags, openMode);
      }
    }
    if( fd<0 ){
      int rc2 = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      if( rc==SQLITE_OK ) rc = rc2;
      goto open_finished;
    }

    /* The owner of the rollback journal or WAL file should always be the
    ** same as the owner of the database file.  Try to ensure that this is
    ** the case.  The chown() system call will be a no-op if the current
    ** process lacks root privileges, be we should at least try.  Without
    ** this step, if a root process opens a database file, it can leave
    ** behinds a journal/WAL that is owned by root and hence make the
    ** database inaccessible to unprivileged processes.
    **
    ** If openMode==0, then that means uid and gid are not set correctly
    ** (probably because SQLite is configured to use 8+3 filename mode) and
    ** in that case we do not want to attempt the chown().
    */
    if( openMode && (flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL))!=0 ){
      robustFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pPreallocatedUnused ){
    p->pPreallocatedUnused->fd = fd;
    p->pPreallocatedUnused->flags =
                          flags & (SQLITE_OPEN_READONLY|SQLITE_OPEN_READWRITE);
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#elif defined(SQLITE_UNLINK_AFTER_CLOSE)
    zPath = sqlite3_mprintf("%s", zName);
    if( zPath==0 ){
      robust_close(p, fd, __LINE__);
      return SQLITE_NOMEM_BKPT;
    }
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif

#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    storeLastErrno(p, errno);
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
  if (0 == strncmp("exfat", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  noLock = eType!=SQLITE_OPEN_MAIN_DB;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( isNewJrnl )               ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile
          ** and clear all the structure's references.  Specifically,
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif

  assert( zPath==0 || zPath[0]=='/'
      || eType==SQLITE_OPEN_SUPER_JOURNAL || eType==SQLITE_OPEN_MAIN_JOURNAL
  );
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pPreallocatedUnused);
  }
  return rc;
}